

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall Stack2_advanced_Except_Test::TestBody(Stack2_advanced_Except_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  Stack<Stack<int>_> r;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  string local_30;
  Stack<Stack<int>_> local_10;
  
  local_10.top = (Node *)0x0;
  Stack<Stack<int>_>::head(&local_10);
  local_48[0] = (internal)0x0;
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::Message::Message((Message *)&local_50);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_30,local_48,(AssertionResult *)"flag","false","true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
             ,0x8f,local_30._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_50.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_50.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Stack<Stack<int>_>::~Stack(&local_10);
  return;
}

Assistant:

TEST(Stack2_advanced, Except) {
	bool flag = false;
	Stack<Stack<int>> r;
	try {
		r.head();
	}
	catch (std::exception & e) {
		EXPECT_EQ(std::string(e.what()), "The stack is empty!");
		flag = true;
	}
	EXPECT_TRUE(flag);
}